

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_ACS_Suspend(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  char *pcVar1;
  level_info_t *plVar2;
  level_info_t *info;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (arg1 == 0) {
    pcVar1 = FString::operator_cast_to_char_(&level.MapName);
    P_SuspendScript(arg0,pcVar1);
  }
  else {
    plVar2 = FindLevelByNum(arg1);
    if (plVar2 != (level_info_t *)0x0) {
      pcVar1 = FString::operator_cast_to_char_(&plVar2->MapName);
      P_SuspendScript(arg0,pcVar1);
    }
  }
  return 1;
}

Assistant:

FUNC(LS_ACS_Suspend)
// ACS_Suspend (script, map)
{
	level_info_t *info;

	if (arg1 == 0)
		P_SuspendScript (arg0, level.MapName);
	else if ((info = FindLevelByNum (arg1)) )
		P_SuspendScript (arg0, info->MapName);

	return true;
}